

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_ar.c
# Opt level: O3

uint64_t ar_atol10(char *p,uint char_cnt)

{
  char cVar1;
  char *pcVar2;
  uint uVar3;
  long lVar4;
  uint64_t uVar5;
  bool bVar6;
  
  pcVar2 = p + char_cnt;
  while( true ) {
    cVar1 = *p;
    if ((cVar1 != ' ') && (cVar1 != '\t')) goto LAB_0063a336;
    bVar6 = char_cnt == 0;
    char_cnt = char_cnt - 1;
    if (bVar6) break;
    p = p + 1;
  }
  cVar1 = *pcVar2;
  char_cnt = 0xffffffff;
  p = pcVar2;
LAB_0063a336:
  uVar3 = (int)cVar1 - 0x30;
  if (9 < uVar3 || cVar1 < '0') {
    return 0;
  }
  lVar4 = 0;
  uVar5 = 0;
  while( true ) {
    if (char_cnt == (uint)lVar4) {
      return uVar5;
    }
    if (0x1999999999999999 < uVar5) {
      return 0xffffffffffffffff;
    }
    if (uVar5 == 0x1999999999999999 && 5 < uVar3) {
      return 0xffffffffffffffff;
    }
    uVar5 = (ulong)uVar3 + uVar5 * 10;
    if (p[lVar4 + 1] < 0x30) break;
    uVar3 = (int)p[lVar4 + 1] - 0x30;
    lVar4 = lVar4 + 1;
    if (9 < uVar3) {
      return uVar5;
    }
  }
  return uVar5;
}

Assistant:

static uint64_t
ar_atol10(const char *p, unsigned char_cnt)
{
	uint64_t l, limit, last_digit_limit;
	unsigned int base, digit;

	base = 10;
	limit = UINT64_MAX / base;
	last_digit_limit = UINT64_MAX % base;

	while ((*p == ' ' || *p == '\t') && char_cnt-- > 0)
		p++;
	l = 0;
	digit = *p - '0';
	while (*p >= '0' && digit < base  && char_cnt-- > 0) {
		if (l > limit || (l == limit && digit > last_digit_limit)) {
			l = UINT64_MAX; /* Truncate on overflow. */
			break;
		}
		l = (l * base) + digit;
		digit = *++p - '0';
	}
	return (l);
}